

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scriptpubkeyman.cpp
# Opt level: O2

optional<common::PSBTError> __thiscall
wallet::DescriptorScriptPubKeyMan::FillPSBT
          (DescriptorScriptPubKeyMan *this,PartiallySignedTransaction *psbtx,
          PrecomputedTransactionData *txdata,int sighash_type,bool sign,bool bip32derivs,
          int *n_signed,bool finalize)

{
  long lVar1;
  element_type *peVar2;
  pointer pCVar3;
  bool bVar4;
  TxoutType TVar5;
  reference input;
  _Base_ptr p_Var6;
  reference pvVar7;
  ulong uVar8;
  prevector<28U,_unsigned_char,_unsigned_int,_int> *other;
  uint uVar9;
  XOnlyPubKey *pubkey;
  long lVar10;
  pointer pCVar11;
  long in_FS_OFFSET;
  ulong uStack_180;
  vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  sols;
  vector<CPubKey,_std::allocator<CPubKey>_> pubkeys;
  unique_ptr<FlatSigningProvider,_std::default_delete<FlatSigningProvider>_> script_keys;
  unique_ptr<FlatSigningProvider,_std::default_delete<FlatSigningProvider>_> keys;
  CPubKey fullpubkey;
  uchar b [33];
  uchar local_67 [7];
  _Base_ptr local_60;
  CScript script;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (n_signed != (int *)0x0) {
    *n_signed = 0;
  }
  uVar9 = 0;
  do {
    uVar8 = (ulong)uVar9;
    lVar10 = *(long *)&(psbtx->tx).super__Optional_base<CMutableTransaction,_false,_false>.
                       _M_payload.super__Optional_payload<CMutableTransaction,_true,_false,_false>.
                       super__Optional_payload_base<CMutableTransaction>._M_payload._M_value.vin;
    if ((ulong)(((long)(psbtx->tx).super__Optional_base<CMutableTransaction,_false,_false>.
                       _M_payload.super__Optional_payload<CMutableTransaction,_true,_false,_false>.
                       super__Optional_payload_base<CMutableTransaction>._M_payload._M_value.vin.
                       super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                       super__Vector_impl_data._M_finish - lVar10) / 0x68) <= uVar8) {
      uStack_180 = 0;
      for (uVar9 = 0;
          (ulong)uVar9 <
          (ulong)(((long)(psbtx->tx).super__Optional_base<CMutableTransaction,_false,_false>.
                         _M_payload.super__Optional_payload<CMutableTransaction,_true,_false,_false>
                         .super__Optional_payload_base<CMutableTransaction>._M_payload._M_value.vout
                         .super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                         super__Vector_impl_data._M_finish -
                  (long)(psbtx->tx).super__Optional_base<CMutableTransaction,_false,_false>.
                        _M_payload.super__Optional_payload<CMutableTransaction,_true,_false,_false>.
                        super__Optional_payload_base<CMutableTransaction>._M_payload._M_value.vout.
                        super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                        super__Vector_impl_data._M_start) / 0x28); uVar9 = uVar9 + 1) {
        pvVar7 = std::vector<CTxOut,_std::allocator<CTxOut>_>::at
                           (&(psbtx->tx).super__Optional_base<CMutableTransaction,_false,_false>.
                             _M_payload.
                             super__Optional_payload<CMutableTransaction,_true,_false,_false>.
                             super__Optional_payload_base<CMutableTransaction>._M_payload._M_value.
                             vout,(ulong)uVar9);
        (*(this->super_ScriptPubKeyMan)._vptr_ScriptPubKeyMan[0x15])(b,this,&pvVar7->scriptPubKey);
        if (CONCAT71(b._1_7_,b[0]) != 0) {
          fullpubkey.vch._0_8_ = &PTR__SigningProvider_01158df0;
          fullpubkey.vch[8] = '\x01';
          fullpubkey.vch[9] = !bip32derivs;
          fullpubkey.vch._16_8_ = CONCAT71(b._1_7_,b[0]);
          UpdatePSBTOutput((SigningProvider *)&fullpubkey,psbtx,uVar9);
          if ((long *)CONCAT71(b._1_7_,b[0]) != (long *)0x0) {
            (**(code **)(*(long *)CONCAT71(b._1_7_,b[0]) + 8))();
          }
        }
      }
      uVar8 = 0;
LAB_00976a2d:
      if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
        __stack_chk_fail();
      }
      return (_Optional_base<common::PSBTError,_true,_true>)
             (_Optional_base<common::PSBTError,_true,_true>)(uVar8 | uStack_180);
    }
    input = std::vector<PSBTInput,_std::allocator<PSBTInput>_>::at(&psbtx->inputs,uVar8);
    bVar4 = PSBTInputSigned(input);
    if (!bVar4) {
      if (((sign) &&
          ((input->sighash_type).super__Optional_base<int,_true,_true>._M_payload.
           super__Optional_payload_base<int>._M_engaged == true)) &&
         ((input->sighash_type).super__Optional_base<int,_true,_true>._M_payload.
          super__Optional_payload_base<int>._M_payload._M_value != sighash_type)) {
        uStack_180 = 1;
        uVar8 = 0x100000000;
        goto LAB_00976a2d;
      }
      script.super_CScriptBase._union._16_8_ = 0;
      script.super_CScriptBase._24_8_ = 0;
      script.super_CScriptBase._union.indirect_contents.indirect = (char *)0x0;
      script.super_CScriptBase._union._8_8_ = 0;
      if ((input->witness_utxo).nValue == -1) {
        peVar2 = (input->non_witness_utxo).
                 super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        if (peVar2 != (element_type *)0x0) {
          uVar8 = (ulong)*(uint *)(lVar10 + 0x20 + uVar8 * 0x68);
          lVar10 = (long)(peVar2->vout).super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                         super__Vector_impl_data._M_start;
          if (uVar8 < (ulong)(((long)(peVar2->vout).
                                     super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                                     super__Vector_impl_data._M_finish - lVar10) / 0x28)) {
            other = (prevector<28U,_unsigned_char,_unsigned_int,_int> *)(lVar10 + uVar8 * 0x28 + 8);
            goto LAB_00976687;
          }
          uVar8 = 0x100000000;
          prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector(&script.super_CScriptBase);
          uStack_180 = 0;
          goto LAB_00976a2d;
        }
      }
      else {
        other = &(input->witness_utxo).scriptPubKey.super_CScriptBase;
LAB_00976687:
        prevector<28U,_unsigned_char,_unsigned_int,_int>::operator=(&script.super_CScriptBase,other)
        ;
        std::make_unique<FlatSigningProvider>();
        GetSigningProvider((DescriptorScriptPubKeyMan *)&script_keys,(CScript *)this,
                           SUB81(&script,0));
        if ((__uniq_ptr_impl<FlatSigningProvider,_std::default_delete<FlatSigningProvider>_>)
            script_keys._M_t.
            super___uniq_ptr_impl<FlatSigningProvider,_std::default_delete<FlatSigningProvider>_>.
            _M_t.
            super__Tuple_impl<0UL,_FlatSigningProvider_*,_std::default_delete<FlatSigningProvider>_>
            .super__Head_base<0UL,_FlatSigningProvider_*,_false>._M_head_impl ==
            (__uniq_ptr_impl<FlatSigningProvider,_std::default_delete<FlatSigningProvider>_>)0x0) {
          pubkeys.super__Vector_base<CPubKey,_std::allocator<CPubKey>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          pubkeys.super__Vector_base<CPubKey,_std::allocator<CPubKey>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          pubkeys.super__Vector_base<CPubKey,_std::allocator<CPubKey>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          std::vector<CPubKey,_std::allocator<CPubKey>_>::reserve
                    (&pubkeys,(input->hd_keypaths)._M_t._M_impl.super__Rb_tree_header._M_node_count
                              + 2);
          for (p_Var6 = (input->hd_keypaths)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
              (_Rb_tree_header *)p_Var6 != &(input->hd_keypaths)._M_t._M_impl.super__Rb_tree_header;
              p_Var6 = (_Base_ptr)std::_Rb_tree_increment((_Rb_tree_node_base *)p_Var6)) {
            std::vector<CPubKey,_std::allocator<CPubKey>_>::push_back
                      (&pubkeys,(value_type *)(p_Var6 + 1));
          }
          sols.
          super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          sols.
          super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          sols.
          super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          TVar5 = Solver(&script,&sols);
          if (TVar5 == WITNESS_V1_TAPROOT) {
            fullpubkey.vch[0] = '\x02';
            std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_insert_rval
                      (sols.
                       super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start,
                       (const_iterator)
                       ((sols.
                         super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                       super__Vector_impl_data._M_start,(value_type_conflict3 *)&fullpubkey);
            std::vector<CPubKey,std::allocator<CPubKey>>::
            emplace_back<std::vector<unsigned_char,std::allocator<unsigned_char>>&>
                      ((vector<CPubKey,std::allocator<CPubKey>> *)&pubkeys,
                       sols.
                       super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start);
            *((sols.
               super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start)->
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
             super__Vector_impl_data._M_start = '\x03';
            std::vector<CPubKey,std::allocator<CPubKey>>::
            emplace_back<std::vector<unsigned_char,std::allocator<unsigned_char>>&>
                      ((vector<CPubKey,std::allocator<CPubKey>> *)&pubkeys,
                       sols.
                       super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start);
          }
          for (p_Var6 = (input->m_tap_bip32_paths)._M_t._M_impl.super__Rb_tree_header._M_header.
                        _M_left;
              pCVar3 = pubkeys.super__Vector_base<CPubKey,_std::allocator<CPubKey>_>._M_impl.
                       super__Vector_impl_data._M_finish,
              pCVar11 = pubkeys.super__Vector_base<CPubKey,_std::allocator<CPubKey>_>._M_impl.
                        super__Vector_impl_data._M_start,
              (_Rb_tree_header *)p_Var6 !=
              &(input->m_tap_bip32_paths)._M_t._M_impl.super__Rb_tree_header;
              p_Var6 = (_Base_ptr)std::_Rb_tree_increment((_Rb_tree_node_base *)p_Var6)) {
            local_60 = (_Base_ptr)0x300000002;
            for (lVar10 = 0; lVar10 != 8; lVar10 = lVar10 + 4) {
              b[0] = *(uchar *)((long)&local_60 + lVar10);
              b._17_7_ = SUB87(p_Var6[1]._M_left,0);
              b[0x18] = (uchar)((ulong)p_Var6[1]._M_left >> 0x38);
              b._25_7_ = SUB87(p_Var6[1]._M_right,0);
              b[0x20] = (uchar)((ulong)p_Var6[1]._M_right >> 0x38);
              b._1_7_ = (undefined7)*(undefined8 *)(p_Var6 + 1);
              b[8] = (uchar)((ulong)*(undefined8 *)(p_Var6 + 1) >> 0x38);
              b._9_7_ = SUB87(p_Var6[1]._M_parent,0);
              b[0x10] = (uchar)((ulong)p_Var6[1]._M_parent >> 0x38);
              fullpubkey.vch[0] = 0xff;
              CPubKey::Set<unsigned_char*>(&fullpubkey,b,local_67);
              std::vector<CPubKey,_std::allocator<CPubKey>_>::push_back
                        (&pubkeys,(value_type *)&fullpubkey);
            }
          }
          for (; pCVar11 != pCVar3; pCVar11 = pCVar11 + 1) {
            GetSigningProvider((DescriptorScriptPubKeyMan *)&fullpubkey,(CPubKey *)this);
            if (fullpubkey.vch._0_8_ != 0) {
              FlatSigningProvider::Merge
                        ((FlatSigningProvider *)
                         keys._M_t.
                         super___uniq_ptr_impl<FlatSigningProvider,_std::default_delete<FlatSigningProvider>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_FlatSigningProvider_*,_std::default_delete<FlatSigningProvider>_>
                         .super__Head_base<0UL,_FlatSigningProvider_*,_false>._M_head_impl,
                         (FlatSigningProvider *)fullpubkey.vch._0_8_);
            }
            std::unique_ptr<FlatSigningProvider,_std::default_delete<FlatSigningProvider>_>::
            ~unique_ptr((unique_ptr<FlatSigningProvider,_std::default_delete<FlatSigningProvider>_>
                         *)&fullpubkey);
          }
          std::
          vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
          ::~vector(&sols);
          std::_Vector_base<CPubKey,_std::allocator<CPubKey>_>::~_Vector_base
                    ((_Vector_base<CPubKey,_std::allocator<CPubKey>_> *)&pubkeys);
        }
        else {
          FlatSigningProvider::Merge
                    ((FlatSigningProvider *)
                     keys._M_t.
                     super___uniq_ptr_impl<FlatSigningProvider,_std::default_delete<FlatSigningProvider>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_FlatSigningProvider_*,_std::default_delete<FlatSigningProvider>_>
                     .super__Head_base<0UL,_FlatSigningProvider_*,_false>._M_head_impl,
                     (FlatSigningProvider *)
                     script_keys._M_t.
                     super___uniq_ptr_impl<FlatSigningProvider,_std::default_delete<FlatSigningProvider>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_FlatSigningProvider_*,_std::default_delete<FlatSigningProvider>_>
                     .super__Head_base<0UL,_FlatSigningProvider_*,_false>._M_head_impl);
        }
        fullpubkey.vch._0_8_ = &PTR__SigningProvider_01158df0;
        fullpubkey.vch._16_8_ =
             keys._M_t.
             super___uniq_ptr_impl<FlatSigningProvider,_std::default_delete<FlatSigningProvider>_>.
             _M_t.
             super__Tuple_impl<0UL,_FlatSigningProvider_*,_std::default_delete<FlatSigningProvider>_>
             .super__Head_base<0UL,_FlatSigningProvider_*,_false>._M_head_impl;
        fullpubkey.vch[8] = !sign;
        fullpubkey.vch[9] = !bip32derivs;
        SignPSBTInput((SigningProvider *)&fullpubkey,psbtx,uVar9,txdata,sighash_type,
                      (SignatureData *)0x0,finalize);
        bVar4 = PSBTInputSigned(input);
        if ((n_signed != (int *)0x0) && (bVar4 || !sign)) {
          *n_signed = *n_signed + 1;
        }
        std::unique_ptr<FlatSigningProvider,_std::default_delete<FlatSigningProvider>_>::~unique_ptr
                  (&script_keys);
        std::unique_ptr<FlatSigningProvider,_std::default_delete<FlatSigningProvider>_>::~unique_ptr
                  (&keys);
      }
      prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector(&script.super_CScriptBase);
    }
    uVar9 = uVar9 + 1;
  } while( true );
}

Assistant:

std::optional<PSBTError> DescriptorScriptPubKeyMan::FillPSBT(PartiallySignedTransaction& psbtx, const PrecomputedTransactionData& txdata, int sighash_type, bool sign, bool bip32derivs, int* n_signed, bool finalize) const
{
    if (n_signed) {
        *n_signed = 0;
    }
    for (unsigned int i = 0; i < psbtx.tx->vin.size(); ++i) {
        const CTxIn& txin = psbtx.tx->vin[i];
        PSBTInput& input = psbtx.inputs.at(i);

        if (PSBTInputSigned(input)) {
            continue;
        }

        // Get the Sighash type
        if (sign && input.sighash_type != std::nullopt && *input.sighash_type != sighash_type) {
            return PSBTError::SIGHASH_MISMATCH;
        }

        // Get the scriptPubKey to know which SigningProvider to use
        CScript script;
        if (!input.witness_utxo.IsNull()) {
            script = input.witness_utxo.scriptPubKey;
        } else if (input.non_witness_utxo) {
            if (txin.prevout.n >= input.non_witness_utxo->vout.size()) {
                return PSBTError::MISSING_INPUTS;
            }
            script = input.non_witness_utxo->vout[txin.prevout.n].scriptPubKey;
        } else {
            // There's no UTXO so we can just skip this now
            continue;
        }

        std::unique_ptr<FlatSigningProvider> keys = std::make_unique<FlatSigningProvider>();
        std::unique_ptr<FlatSigningProvider> script_keys = GetSigningProvider(script, /*include_private=*/sign);
        if (script_keys) {
            keys->Merge(std::move(*script_keys));
        } else {
            // Maybe there are pubkeys listed that we can sign for
            std::vector<CPubKey> pubkeys;
            pubkeys.reserve(input.hd_keypaths.size() + 2);

            // ECDSA Pubkeys
            for (const auto& [pk, _] : input.hd_keypaths) {
                pubkeys.push_back(pk);
            }

            // Taproot output pubkey
            std::vector<std::vector<unsigned char>> sols;
            if (Solver(script, sols) == TxoutType::WITNESS_V1_TAPROOT) {
                sols[0].insert(sols[0].begin(), 0x02);
                pubkeys.emplace_back(sols[0]);
                sols[0][0] = 0x03;
                pubkeys.emplace_back(sols[0]);
            }

            // Taproot pubkeys
            for (const auto& pk_pair : input.m_tap_bip32_paths) {
                const XOnlyPubKey& pubkey = pk_pair.first;
                for (unsigned char prefix : {0x02, 0x03}) {
                    unsigned char b[33] = {prefix};
                    std::copy(pubkey.begin(), pubkey.end(), b + 1);
                    CPubKey fullpubkey;
                    fullpubkey.Set(b, b + 33);
                    pubkeys.push_back(fullpubkey);
                }
            }

            for (const auto& pubkey : pubkeys) {
                std::unique_ptr<FlatSigningProvider> pk_keys = GetSigningProvider(pubkey);
                if (pk_keys) {
                    keys->Merge(std::move(*pk_keys));
                }
            }
        }

        SignPSBTInput(HidingSigningProvider(keys.get(), /*hide_secret=*/!sign, /*hide_origin=*/!bip32derivs), psbtx, i, &txdata, sighash_type, nullptr, finalize);

        bool signed_one = PSBTInputSigned(input);
        if (n_signed && (signed_one || !sign)) {
            // If sign is false, we assume that we _could_ sign if we get here. This
            // will never have false negatives; it is hard to tell under what i
            // circumstances it could have false positives.
            (*n_signed)++;
        }
    }

    // Fill in the bip32 keypaths and redeemscripts for the outputs so that hardware wallets can identify change
    for (unsigned int i = 0; i < psbtx.tx->vout.size(); ++i) {
        std::unique_ptr<SigningProvider> keys = GetSolvingProvider(psbtx.tx->vout.at(i).scriptPubKey);
        if (!keys) {
            continue;
        }
        UpdatePSBTOutput(HidingSigningProvider(keys.get(), /*hide_secret=*/true, /*hide_origin=*/!bip32derivs), psbtx, i);
    }

    return {};
}